

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec3 __thiscall djb::microfacet::u2_to_s2(microfacet *this,vec2 *u,vec3 *wi,void *user_args)

{
  long lVar1;
  args *paVar2;
  vec3 vVar3;
  vec3 local_70;
  args args;
  
  if (user_args == (void *)0x0) {
    microfacet::args::standard();
  }
  else {
    paVar2 = &args;
    for (lVar1 = 0x13; lVar1 != 0; lVar1 = lVar1 + -1) {
      (paVar2->mtra).r[0].x = *user_args;
      user_args = (float_t *)((long)user_args + 4);
      paVar2 = (args *)&(paVar2->mtra).r[0].y;
    }
  }
  local_70 = u2_to_h2(this,u,wi,&args);
  vVar3 = h2_to_s2(this,&local_70,wi);
  return vVar3;
}

Assistant:

vec3
microfacet::u2_to_s2(const vec2 &u, const vec3 &wi, const void *user_args) const
{
	//DJB_ASSERT(wi.z >= 0 && "invalid incident direction");
	microfacet::args args =
		user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
		          : microfacet::args::standard();

	return h2_to_s2(u2_to_h2(u, wi, args), wi);
}